

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abstract.h
# Opt level: O0

void Abstract<4U>::DistributeCheck
               (HashMap<4U> *mp,count_type HIT,HashMap<4U> *data2block,Abstract<4U> **sketches,
               vector<double,_std::allocator<double>_> *outs)

{
  long *plVar1;
  value_type vVar2;
  value_type vVar3;
  bool bVar4;
  int iVar5;
  mapped_type *pmVar6;
  pointer pvVar7;
  reference pvVar8;
  long in_RCX;
  int in_ESI;
  vector<double,_std::allocator<double>_> *in_R8;
  double dVar9;
  int pos;
  double rt;
  double pr;
  double cr;
  double are;
  double aae;
  count_type flagtrue;
  count_type size;
  count_type hit;
  count_type all;
  count_type value;
  const_iterator it;
  unordered_map<Data<4U>,_int,_My_Hash<4U>,_std::equal_to<Data<4U>_>,_std::allocator<std::pair<const_Data<4U>,_int>_>_>
  *in_stack_ffffffffffffff28;
  unordered_map<Data<4U>,_int,_My_Hash<4U>,_std::equal_to<Data<4U>_>,_std::allocator<std::pair<const_Data<4U>,_int>_>_>
  *in_stack_ffffffffffffff30;
  double local_c8;
  _Node_iterator_base<std::pair<const_Data<4U>,_int>,_true> local_80;
  _Node_iterator_base<std::pair<const_Data<4U>,_int>,_true> local_78;
  undefined8 local_70;
  value_type local_68;
  value_type local_60;
  double local_58;
  double local_50;
  int local_44;
  int local_40;
  int local_3c;
  int local_38;
  int local_34;
  _Node_iterator_base<std::pair<const_Data<4U>,_int>,_true> local_30;
  vector<double,_std::allocator<double>_> *local_28;
  long local_20;
  int local_c;
  
  local_28 = in_R8;
  local_20 = in_RCX;
  local_c = in_ESI;
  std::__detail::_Node_const_iterator<std::pair<const_Data<4U>,_int>,_false,_true>::
  _Node_const_iterator
            ((_Node_const_iterator<std::pair<const_Data<4U>,_int>,_false,_true> *)0x11c0eb);
  local_34 = 0;
  local_38 = 0;
  local_3c = 0;
  local_40 = 0;
  local_44 = 0;
  local_50 = 0.0;
  local_58 = 0.0;
  local_60 = 0.0;
  local_68 = 0.0;
  local_70 = 0;
  local_78._M_cur =
       (__node_type *)
       std::
       unordered_map<Data<4U>,_int,_My_Hash<4U>,_std::equal_to<Data<4U>_>,_std::allocator<std::pair<const_Data<4U>,_int>_>_>
       ::begin(in_stack_ffffffffffffff28);
  local_30._M_cur = local_78._M_cur;
  while( true ) {
    local_80._M_cur =
         (__node_type *)
         std::
         unordered_map<Data<4U>,_int,_My_Hash<4U>,_std::equal_to<Data<4U>_>,_std::allocator<std::pair<const_Data<4U>,_int>_>_>
         ::end(in_stack_ffffffffffffff28);
    bVar4 = std::__detail::operator!=(&local_30,&local_80);
    if (!bVar4) break;
    std::__detail::_Node_const_iterator<std::pair<const_Data<4U>,_int>,_false,_true>::operator->
              ((_Node_const_iterator<std::pair<const_Data<4U>,_int>,_false,_true> *)0x11c1c0);
    pmVar6 = std::
             unordered_map<Data<4U>,_int,_My_Hash<4U>,_std::equal_to<Data<4U>_>,_std::allocator<std::pair<const_Data<4U>,_int>_>_>
             ::operator[](in_stack_ffffffffffffff30,(key_type *)in_stack_ffffffffffffff28);
    plVar1 = *(long **)(local_20 + (long)*pmVar6 * 8);
    pvVar7 = std::__detail::_Node_const_iterator<std::pair<const_Data<4U>,_int>,_false,_true>::
             operator->((_Node_const_iterator<std::pair<const_Data<4U>,_int>,_false,_true> *)
                        0x11c1f6);
    local_34 = (**(code **)(*plVar1 + 0x18))(plVar1,pvVar7);
    pvVar7 = std::__detail::_Node_const_iterator<std::pair<const_Data<4U>,_int>,_false,_true>::
             operator->((_Node_const_iterator<std::pair<const_Data<4U>,_int>,_false,_true> *)
                        0x11c218);
    if (local_c < pvVar7->second) {
      local_38 = local_38 + 1;
      if (local_34 < 0) {
        local_34 = -local_34;
        local_44 = local_44 + 1;
      }
      if (local_c < local_34) {
        local_3c = local_3c + 1;
        pvVar7 = std::__detail::_Node_const_iterator<std::pair<const_Data<4U>,_int>,_false,_true>::
                 operator->((_Node_const_iterator<std::pair<const_Data<4U>,_int>,_false,_true> *)
                            0x11c296);
        iVar5 = pvVar7->second - local_34;
        if (iVar5 < 1) {
          iVar5 = -iVar5;
        }
        local_50 = (double)iVar5 + local_50;
        pvVar7 = std::__detail::_Node_const_iterator<std::pair<const_Data<4U>,_int>,_false,_true>::
                 operator->((_Node_const_iterator<std::pair<const_Data<4U>,_int>,_false,_true> *)
                            0x11c2ca);
        iVar5 = pvVar7->second - local_34;
        if (iVar5 < 1) {
          iVar5 = -iVar5;
        }
        pvVar7 = std::__detail::_Node_const_iterator<std::pair<const_Data<4U>,_int>,_false,_true>::
                 operator->((_Node_const_iterator<std::pair<const_Data<4U>,_int>,_false,_true> *)
                            0x11c2f2);
        local_58 = (double)iVar5 / (double)pvVar7->second + local_58;
      }
    }
    if (local_c < local_34) {
      local_40 = local_40 + 1;
    }
    std::__detail::_Node_const_iterator<std::pair<const_Data<4U>,_int>,_false,_true>::operator++
              ((_Node_const_iterator<std::pair<const_Data<4U>,_int>,_false,_true> *)
               in_stack_ffffffffffffff30);
  }
  local_50 = local_50 / (double)local_3c;
  dVar9 = local_58 / (double)local_3c;
  local_60 = (double)local_3c / (double)local_38;
  local_68 = (double)local_3c / (double)local_40;
  local_58 = dVar9;
  pvVar8 = std::vector<double,_std::allocator<double>_>::operator[](local_28,0);
  vVar3 = local_60;
  *pvVar8 = dVar9;
  pvVar8 = std::vector<double,_std::allocator<double>_>::operator[](local_28,1);
  vVar2 = local_68;
  *pvVar8 = vVar3;
  pvVar8 = std::vector<double,_std::allocator<double>_>::operator[](local_28,2);
  *pvVar8 = vVar2;
  if (1e-06 <= local_60 + local_68) {
    local_c8 = local_60 + local_68;
  }
  else {
    local_c8 = 1.0;
  }
  local_c8 = (local_68 * 2.0 * local_60) / local_c8;
  pvVar8 = std::vector<double,_std::allocator<double>_>::operator[](local_28,3);
  *pvVar8 = local_c8;
  return;
}

Assistant:

static void DistributeCheck(const HashMap<DATA_LEN>& mp, count_type HIT, HashMap<DATA_LEN>& data2block, Abstract<DATA_LEN>** sketches, std::vector<double>& outs)
	{
		typename HashMap<DATA_LEN>::const_iterator it;
		count_type value = 0, all = 0, hit = 0, size = 0, flagtrue = 0;
		double aae = 0, are = 0, cr = 0, pr = 0, rt = 0;
		for (it = mp.begin(); it != mp.end(); ++it) {
			int pos = data2block[it->first];
			value = sketches[pos]->QueryTopK(it->first);
			if (it->second > HIT) {
				all++;
				if (value < 0) {
					value = -value;
					flagtrue += 1;
				}
				if (value > HIT) {
					hit += 1;
					aae += abs(it->second - value);
					are += abs(it->second - value) / (double)it->second;
				}
			}
			if (value > HIT)
			{
				size += 1;
			}
		}

		aae /= hit;
		are /= hit;
		cr = hit / (double)all;
		pr = hit / (double)size;

		outs[0] = are;
		outs[1] = cr;
		outs[2] = pr;
		outs[3] = 2 * pr * cr / ((cr + pr < 1e-6) ? 1 : cr + pr);
	}